

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerProfiledLdElemI(Lowerer *this,JitProfilingInstr *instr)

{
  LowererMD *this_00;
  Func *func;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  AddrOpnd *pAVar6;
  Opnd *this_01;
  IndirOpnd *this_02;
  RegOpnd *opndArg;
  HelperCallOpnd *newSrc;
  
  if (instr == (JitProfilingInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2337,"(instr)","instr");
    if (!bVar2) goto LAB_0056e77d;
    *puVar4 = 0;
  }
  func = (instr->super_Instr).m_func;
  this_00 = &this->m_lowererMD;
  pIVar5 = IR::IntConstOpnd::New(0,TyInt8,func,false);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pIVar5->super_Opnd);
  pIVar5 = IR::IntConstOpnd::New(0,TyInt8,func,false);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pIVar5->super_Opnd);
  pIVar5 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,func);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pIVar5->super_Opnd);
  pAVar6 = CreateFunctionBodyOpnd(this,func);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pAVar6->super_Opnd);
  this_01 = IR::Instr::UnlinkSrc1(&instr->super_Instr);
  this_02 = IR::Opnd::AsIndirOpnd(this_01);
  pAVar6 = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(this_02);
  if (pAVar6 == (AddrOpnd *)0x0) {
    uVar3 = this_02->m_offset;
    if ((int)uVar3 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x234b,
                         "(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()))"
                         ,
                         "indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset())"
                        );
      if (!bVar2) {
LAB_0056e77d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      uVar3 = this_02->m_offset;
    }
    pAVar6 = IR::AddrOpnd::New((Var)((ulong)uVar3 | 0x1000000000000),AddrOpndKindDynamicVar,func,
                               false,(Var)0x0);
  }
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pAVar6->super_Opnd);
  opndArg = IR::IndirOpnd::UnlinkBaseOpnd(this_02);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&opndArg->super_Opnd);
  IR::Opnd::Free(&this_02->super_Opnd,func);
  newSrc = IR::HelperCallOpnd::New(HelperProfiledLdElem,func);
  IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(this_00,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledLdElemI(IR::JitProfilingInstr *const instr)
{
    Assert(instr);

    /*
        Var ProfilingHelpers::ProfiledLdElem(
            const Var base,
            const Var varIndex,
            FunctionBody *const functionBody,
            const ProfileId profileId,
            bool didArrayAccessHelperCall,
            bool bailedOutOnArraySpecialization)
    */

    Func *const func = instr->m_func;

    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(func));
    IR::IndirOpnd *const indir = instr->UnlinkSrc1()->AsIndirOpnd();
    IR::Opnd *const indexOpnd = indir->UnlinkIndexOpnd();
    Assert(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()));
    m_lowererMD.LoadHelperArgument(
        instr,
        indexOpnd
            ? static_cast<IR::Opnd *>(indexOpnd)
            : IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(indir->GetOffset()), IR::AddrOpndKindDynamicVar, func));
    m_lowererMD.LoadHelperArgument(instr, indir->UnlinkBaseOpnd());
    indir->Free(func);

    instr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfiledLdElem, func));
    m_lowererMD.LowerCall(instr, 0);
}